

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_BitMatrixShow(Vec_Wrd_t *vSims,int nWords)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  FILE *pFVar5;
  int iVar6;
  long lVar7;
  long local_60;
  
  uVar1 = (long)vSims->nSize / (long)nWords;
  pFVar5 = (FILE *)vSims;
  if (0 < (int)uVar1) {
    local_60 = 0;
    uVar2 = 0;
    iVar6 = 0;
    do {
      if ((uVar2 & 0x3f) == 0) {
        Abc_Print((int)pFVar5,"\n");
      }
      uVar4 = (ulong)(uint)nWords;
      lVar7 = local_60;
      iVar3 = iVar6;
      if (0 < nWords) {
        do {
          if ((iVar6 < 0) || (vSims->nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          pFVar5 = _stdout;
          Extra_PrintBinary2(_stdout,(uint *)((long)vSims->pArray + lVar7),0x40);
          Abc_Print((int)pFVar5," ");
          uVar4 = uVar4 - 1;
          lVar7 = lVar7 + 8;
          iVar3 = iVar3 + 1;
        } while (uVar4 != 0);
      }
      Abc_Print((int)pFVar5,"\n");
      uVar2 = uVar2 + 1;
      iVar6 = iVar6 + nWords;
      local_60 = local_60 + (ulong)(uint)nWords * 8;
    } while (uVar2 != (uVar1 & 0xffffffff));
  }
  Abc_Print((int)pFVar5,"\n");
  return;
}

Assistant:

void Extra_BitMatrixShow( Vec_Wrd_t * vSims, int nWords )
{
    int i, k, nBits = Vec_WrdSize(vSims)  / nWords;
    for ( i = 0; i < nBits; i++ )
    {
        if ( i%64 == 0 )
            Abc_Print( 1, "\n" );
        for ( k = 0; k < nWords; k++ )
        {
            Extra_PrintBinary2( stdout, (unsigned *)Vec_WrdEntryP(vSims, i*nWords+k), 64 );
            Abc_Print( 1, " " );
        }
        Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
}